

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall amrex::FabArrayBase::~FabArrayBase(FabArrayBase *this)

{
  BoxArray *in_RDI;
  
  *(undefined ***)&in_RDI->m_bat = &PTR__FabArrayBase_01802ed0;
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)0x1000b5d);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x1000b6e);
  DistributionMapping::~DistributionMapping((DistributionMapping *)0x1000b7c);
  BoxArray::~BoxArray(in_RDI);
  return;
}

Assistant:

FabArrayBase::~FabArrayBase () {}